

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9SetRegNum(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  uint uVar3;
  char *format;
  int iVar4;
  
  uVar3 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar2 = Extra_UtilGetopt(argc,argv,"Nh");
    iVar4 = globalUtilOptind;
    if (iVar2 != 0x4e) {
      if (iVar2 == -1) {
        pGVar1 = pAbc->pGia;
        if (pGVar1 == (Gia_Man_t *)0x0) {
          format = "Abc_CommandAbc9SetRegNum(): There is no AIG.\n";
        }
        else if ((int)uVar3 < pGVar1->vCis->nSize) {
          if ((int)uVar3 < pGVar1->vCos->nSize) {
            pGVar1->nRegs = uVar3;
            return 0;
          }
          format = 
          "Abc_CommandAbc9SetRegNum(): The number of registers should be less than the number of COs.\n"
          ;
        }
        else {
          format = 
          "Abc_CommandAbc9SetRegNum(): The number of registers should be less than the number of CIs.\n"
          ;
        }
        iVar4 = -1;
        goto LAB_00277723;
      }
      goto LAB_002776bc;
    }
    if (argc <= globalUtilOptind) break;
    uVar3 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    if ((int)uVar3 < 0) {
LAB_002776bc:
      Abc_Print(-2,"usage: &setregnum [-N num] [-h]\n");
      Abc_Print(-2,
                "\t         manually sets the number of registers to combine the last PI/PO pairs\n"
               );
      Abc_Print(-2,"\t-N num : set the number of registers to be the given number [default = %d]\n",
                (ulong)uVar3);
      format = "\t-h     : print the command usage\n";
      iVar4 = -2;
LAB_00277723:
      Abc_Print(iVar4,format);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_002776bc;
}

Assistant:

int Abc_CommandAbc9SetRegNum( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, nRegNum = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nRegNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nRegNum < 0 )
                goto usage;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9SetRegNum(): There is no AIG.\n" );
        return 1;
    }
    if ( nRegNum >= Gia_ManCiNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9SetRegNum(): The number of registers should be less than the number of CIs.\n" );
        return 1;
    }
    if ( nRegNum >= Gia_ManCoNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9SetRegNum(): The number of registers should be less than the number of COs.\n" );
        return 1;
    }
    pAbc->pGia->nRegs = nRegNum;
    return 0;

usage:
    Abc_Print( -2, "usage: &setregnum [-N num] [-h]\n" );
    Abc_Print( -2, "\t         manually sets the number of registers to combine the last PI/PO pairs\n" );
    Abc_Print( -2, "\t-N num : set the number of registers to be the given number [default = %d]\n", nRegNum );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}